

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O2

void __thiscall OmegaSN::algoISOTONIC(OmegaSN *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  double **ppdVar3;
  ulong uVar4;
  uint u;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  Costs cost;
  uint local_74;
  uint local_70;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  OmegaSN *local_58;
  double local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  local_58 = this;
  Q0init(this,data);
  local_48 = (ulong)((int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1);
  for (local_74 = 2; local_74 < (uint)local_48; local_74 = local_74 + 1) {
    for (uVar9 = 1; uVar9 < local_58->nbSegments; uVar9 = uVar9 + 1) {
      local_68 = 1;
      for (uVar7 = 0; uVar7 != local_40; uVar7 = uVar7 + 1) {
        local_70 = 0;
        uVar4 = uVar9 & 0xffffffff;
        local_50 = INFINITY;
        local_6c = 0;
        while( true ) {
          local_5c = (int)uVar4 + 1;
          if (local_74 <= local_5c) break;
          lVar8 = 0;
          for (uVar5 = 0; uVar4 = (ulong)local_5c, local_68 != uVar5; uVar5 = uVar5 + 1) {
            local_38 = local_58->Q[uVar9 - 1][uVar5][uVar4];
            ppdVar3 = local_58->S12P;
            uVar6 = (ulong)local_74;
            dVar10 = Costs::slopeCost(&cost,(double *)((long)local_58->states + lVar8),
                                      local_58->states + uVar7,&local_5c,&local_74,*ppdVar3 + uVar4,
                                      *ppdVar3 + uVar6,ppdVar3[1] + uVar4,ppdVar3[1] + uVar6,
                                      ppdVar3[2] + uVar4,ppdVar3[2] + uVar6);
            if (dVar10 + local_38 < local_50) {
              local_6c = (uint)uVar5;
              local_50 = dVar10 + local_38;
              local_70 = local_5c;
            }
            lVar8 = lVar8 + 8;
          }
        }
        local_58->Q[uVar9][uVar7][local_74] = local_50;
        local_58->lastChpt[uVar9][uVar7][local_74] = local_70;
        local_58->lastIndState[uVar9][uVar7][local_74] = local_6c;
        local_68 = (ulong)((int)local_68 + 1);
      }
    }
  }
  local_58->pruning = 1.0;
  return;
}

Assistant:

void OmegaSN::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);
  Q0init(data);

  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int nb = 1; nb < nbSegments; nb++)
    {
      for(unsigned int v = 0; v < p; v++)
      {
        ///// EXPLORE MATRIX size p*T
        temp_Q = INFINITY;
        temp_indState = 0;
        temp_chpt = 0;

        for(unsigned int t = nb + 1; t < T; t++)
        {
          for(unsigned int u = 0; u < (v + 1); u++) /////explore column of states
          {
            temp_cost = Q[nb-1][u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]);
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }
        ///// Write response
        Q[nb][v][T] = temp_Q;
        lastChpt[nb][v][T] = temp_chpt;
        lastIndState[nb][v][T] = temp_indState;
        //std::cout << "nb " << nb << " v "<< v << " T " << T << " Q " << temp_Q << " --- " << temp_indState << " && " << temp_chpt << std::endl;
      }
    }
  }
  pruning = 1;

}